

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LookUpTableQuantizationParams::MergeFrom
          (LookUpTableQuantizationParams *this,LookUpTableQuantizationParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6b68);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->floatvalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->floatvalue_,iVar1 + (this->floatvalue_).current_size_);
    memcpy(((this->floatvalue_).rep_)->elements + (this->floatvalue_).current_size_,
           ((from->floatvalue_).rep_)->elements,(long)(from->floatvalue_).current_size_ << 2);
    (this->floatvalue_).current_size_ =
         (this->floatvalue_).current_size_ + (from->floatvalue_).current_size_;
  }
  return;
}

Assistant:

void LookUpTableQuantizationParams::MergeFrom(const LookUpTableQuantizationParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LookUpTableQuantizationParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  floatvalue_.MergeFrom(from.floatvalue_);
}